

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.cpp
# Opt level: O2

void __thiscall
QEasingCurve::addTCBSegment(QEasingCurve *this,QPointF *nextPoint,qreal t,qreal c,qreal b)

{
  double *pdVar1;
  double dVar2;
  TCBPoint *pTVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  QEasingCurveFunction *pQVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  long in_FS_OFFSET;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  TCBPoint local_98;
  QPointF local_68;
  QPointF local_58;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = this->d_ptr->config;
  if (pQVar8 == (QEasingCurveFunction *)0x0) {
    pQVar8 = curveToFunctionObject(this->d_ptr->type);
    this->d_ptr->config = pQVar8;
  }
  local_98._point.xp = nextPoint->xp;
  local_98._point.yp = nextPoint->yp;
  local_98._t = t;
  local_98._c = c;
  local_98._b = b;
  QList<TCBPoint>::emplaceBack<TCBPoint>(&pQVar8->_tcbPoints,&local_98);
  local_98._point.xp = 1.0;
  local_98._point.yp = 1.0;
  bVar7 = qFuzzyCompare(nextPoint,&local_98._point);
  if (bVar7) {
    pQVar8 = this->d_ptr->config;
    local_98._t = 0.0;
    local_98._point.xp = 0.0;
    local_98._point.yp = 0.0;
    iVar4 = (int)(pQVar8->_tcbPoints).d.size;
    iVar11 = iVar4 + -1;
    QList<QPointF>::reserve((QList<QPointF> *)&local_98,(long)(iVar11 * 3));
    lVar10 = 0x50;
    for (uVar9 = 1; (long)uVar9 < (long)iVar4; uVar9 = uVar9 + 1) {
      pTVar3 = (pQVar8->_tcbPoints).d.ptr;
      dVar12 = *(double *)((long)pTVar3 + lVar10 + -0x38);
      dVar2 = *(double *)((long)pTVar3 + lVar10 + -0x10);
      pdVar1 = (double *)((long)&pTVar3[-2]._point.xp + lVar10);
      dVar5 = *pdVar1;
      dVar6 = pdVar1[1];
      pdVar1 = (double *)((long)&pTVar3[-1]._point.xp + lVar10);
      local_48.xp = *pdVar1;
      local_48.yp = pdVar1[1];
      dVar13 = 0.0;
      dVar14 = 0.0;
      dVar24 = -1.0;
      dVar16 = 0.0;
      dVar17 = 0.0;
      if (1 < uVar9) {
        pdVar1 = (double *)((long)&pTVar3[-3]._point.xp + lVar10);
        dVar16 = *pdVar1;
        dVar17 = pdVar1[1];
        dVar24 = *(double *)((long)pTVar3 + lVar10 + -0x30);
      }
      dVar21 = 1.0;
      if ((long)uVar9 < (long)iVar11) {
        pdVar1 = (double *)((long)&(pTVar3->_point).xp + lVar10);
        dVar13 = *pdVar1;
        dVar14 = pdVar1[1];
        dVar21 = *(double *)((long)pTVar3 + lVar10 + -8);
      }
      dVar18 = (1.0 - *(double *)((long)pTVar3 + lVar10 + -0x40)) * 0.5;
      dVar15 = (dVar12 + 1.0) * (dVar24 + 1.0);
      dVar23 = (1.0 - dVar12) * (1.0 - dVar24);
      dVar24 = (1.0 - *(double *)((long)pTVar3 + lVar10 + -0x18)) * 0.5;
      dVar20 = (1.0 - dVar2) * (dVar21 + 1.0);
      dVar12 = (dVar2 + 1.0) * (1.0 - dVar21);
      auVar19._0_8_ =
           dVar18 * (dVar15 * (dVar5 - dVar16) + dVar23 * (local_48.xp - dVar5)) +
           dVar5 * (double)DAT_0051ff10;
      auVar19._8_8_ =
           dVar18 * (dVar15 * (dVar6 - dVar17) + dVar23 * (local_48.yp - dVar6)) +
           dVar6 * DAT_0051ff10._8_8_;
      local_58 = (QPointF)divpd(auVar19,_DAT_0051ff10);
      auVar22._0_8_ =
           local_48.xp * (double)DAT_0051ff10 -
           dVar24 * (dVar20 * (local_48.xp - dVar5) + dVar12 * (dVar13 - local_48.xp));
      auVar22._8_8_ =
           local_48.yp * DAT_0051ff10._8_8_ -
           dVar24 * (dVar20 * (local_48.yp - dVar6) + dVar12 * (dVar14 - local_48.yp));
      local_68 = (QPointF)divpd(auVar22,_DAT_0051ff10);
      QList<QPointF>::emplaceBack<QPointF_const&>((QList<QPointF> *)&local_98,&local_58);
      QList<QPointF>::emplaceBack<QPointF_const&>((QList<QPointF> *)&local_98,&local_68);
      QList<QPointF>::emplaceBack<QPointF_const&>((QList<QPointF> *)&local_98,&local_48);
      lVar10 = lVar10 + 0x28;
    }
    QArrayDataPointer<QPointF>::operator=
              (&(this->d_ptr->config->_bezierCurves).d,(QArrayDataPointer<QPointF> *)&local_98);
    QArrayDataPointer<QPointF>::~QArrayDataPointer((QArrayDataPointer<QPointF> *)&local_98);
    QList<TCBPoint>::clear(&this->d_ptr->config->_tcbPoints);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEasingCurve::addTCBSegment(const QPointF &nextPoint, qreal t, qreal c, qreal b)
{
    if (!d_ptr->config)
        d_ptr->config = curveToFunctionObject(d_ptr->type);

    d_ptr->config->_tcbPoints.append(TCBPoint(nextPoint, t, c, b));

    if (nextPoint == QPointF(1.0, 1.0)) {
        d_ptr->config->_bezierCurves = tcbToBezier(d_ptr->config->_tcbPoints);
        d_ptr->config->_tcbPoints.clear();
    }

}